

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  pointer pVVar5;
  Spline<CMU462::Vector3D> *in_RDX;
  long in_RSI;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_RDI;
  int i;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  Polygon *p;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_> *__range2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_stack_00000530;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_00000538;
  HalfedgeMesh *in_stack_00000540;
  Spectrum *in_stack_fffffffffffffe88;
  HalfedgeMesh *in_stack_fffffffffffffe90;
  Vector3D *value;
  Vector4D *in_stack_fffffffffffffe98;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffea0;
  SceneObject *in_stack_fffffffffffffeb0;
  Mesh *mesh;
  Skeleton *this_00;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *this_01;
  Vector3D local_118;
  Vector3D local_100;
  Spectrum local_e4;
  Vector4D local_d8 [2];
  double local_98;
  double local_90;
  double local_88;
  undefined4 in_stack_ffffffffffffff80;
  int iVar6;
  pointer in_stack_ffffffffffffff88;
  __normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
  local_50;
  long local_48;
  Spline<CMU462::Vector3D> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SceneObject::SceneObject(in_stack_fffffffffffffeb0);
  (in_RDI->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_set_draw_styles_003ba518;
  this_01 = in_RDI + 10;
  HalfedgeMesh::HalfedgeMesh(in_stack_fffffffffffffe90);
  this_00 = (Skeleton *)
            &in_RDI[0xf].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)0x1fe399);
  Vector3D::Vector3D((Vector3D *)
                     &in_RDI[0x10].
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x1fe3c2);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x1fe3d8);
  mesh = (Mesh *)&in_RDI[0x14].
                  super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  MeshResampler::MeshResampler((MeshResampler *)mesh);
  std::
  map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  ::map((map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
         *)0x1fe406);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x1fe413);
  local_48 = local_10 + 0x90;
  local_50._M_current =
       (Polygon *)
       std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::begin
                 ((vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_> *)
                  in_stack_fffffffffffffe88);
  std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::end
            ((vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_> *)
             in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
    ::operator*(&local_50);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
    __gnu_cxx::
    __normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
    ::operator++(&local_50);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector(this_01,in_RDI);
  iVar6 = 0;
  while( true ) {
    uVar2 = (ulong)iVar6;
    sVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size
                      ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                       &stack0xffffffffffffff88);
    if (sVar3 <= uVar2) break;
    in_stack_fffffffffffffea0 = local_18;
    pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                        &stack0xffffffffffffff88,(long)iVar6);
    Vector4D::Vector4D(local_d8,pvVar4,1.0);
    Matrix4x4::operator*
              ((Matrix4x4 *)in_stack_ffffffffffffff88,
               (Vector4D *)CONCAT44(iVar6,in_stack_ffffffffffffff80));
    Vector4D::projectTo3D(in_stack_fffffffffffffe98);
    pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                        &stack0xffffffffffffff88,(long)iVar6);
    pvVar4->x = local_98;
    pvVar4->y = local_90;
    pvVar4->z = local_88;
    iVar6 = iVar6 + 1;
  }
  HalfedgeMesh::build(in_stack_00000540,in_stack_00000538,in_stack_00000530);
  if (*(long *)(local_10 + 0xa8) == 0) {
    in_stack_fffffffffffffe98 = (Vector4D *)operator_new(0x28);
    Spectrum::Spectrum(&local_e4,1.0,1.0,1.0);
    DiffuseBSDF::DiffuseBSDF((DiffuseBSDF *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    in_RDI[0x17].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe98;
  }
  else {
    in_RDI[0x17].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(*(long *)(local_10 + 0xa8) + 0x48);
  }
  Vector3D::Vector3D(&local_100,1.0,1.0,1.0);
  in_RDI[3].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_100.z;
  in_RDI[2].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_100.x;
  in_RDI[3].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_100.y;
  value = (Vector3D *)
          &in_RDI[7].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  Vector3D::Vector3D(&local_118,
                     (Vector3D *)
                     &in_RDI[2].
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  Spline<CMU462::Vector3D>::setValue
            (in_stack_fffffffffffffea0,(double)in_stack_fffffffffffffe98,value);
  pVVar5 = (pointer)operator_new(0x1e0);
  Skeleton::Skeleton(this_00,mesh);
  in_RDI[0xf].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = pVVar5;
  *(undefined1 *)
   &in_RDI[0xf].super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
             in_stack_fffffffffffffea0);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

Mesh::Mesh(Collada::PolymeshInfo &polyMesh, const Matrix4x4 &transform) {
  // Build halfedge mesh from polygon soup
  vector<vector<size_t>> polygons;
  for (const Collada::Polygon &p : polyMesh.polygons) {
    polygons.push_back(p.vertex_indices);
  }
  vector<Vector3D> vertices = polyMesh.vertices;  // DELIBERATE COPY.
  for (int i = 0; i < vertices.size(); i++) {
    vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
  }

  mesh.build(polygons, vertices);
  if (polyMesh.material) {
    bsdf = polyMesh.material->bsdf;
  } else {
    //      bsdf = new DiffuseBSDF(Spectrum(0.5f,0.5f,0.5f));
    bsdf = new DiffuseBSDF(Spectrum(1., 1., 1.));
  }

  scale = Vector3D(1., 1., 1.);
  scales.setValue(0, scale);

  skeleton = new Skeleton(this);

  alreadyCheckingPositions = false;
}